

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

void raviV_op_vararg(lua_State *L,CallInfo *ci,LClosure *cl,int a,int b)

{
  ushort uVar1;
  long lVar2;
  StkId pTVar3;
  StkId pTVar4;
  LuaType *pLVar5;
  uint n;
  uint uVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  
  pTVar3 = (ci->u).l.base;
  uVar8 = ~(uint)cl->p->numparams + (int)((ulong)((long)pTVar3 - (long)ci->func) >> 4);
  n = ~((int)uVar8 >> 0x1f) & uVar8;
  uVar9 = (ulong)n;
  if (b < 1) {
    if ((long)L->stack_last - (long)L->top >> 4 <= (long)uVar9) {
      luaD_growstack(L,n);
    }
    pTVar3 = (ci->u).l.base;
    pTVar4 = pTVar3 + a;
    L->top = pTVar4 + uVar9;
  }
  else {
    n = b - 1;
    pTVar4 = pTVar3 + a;
  }
  if ((int)n < (int)uVar8) {
    uVar8 = n;
  }
  if ((int)uVar8 < 1) {
    uVar6 = 0;
  }
  else {
    uVar6 = 0;
    lVar7 = 0;
    do {
      *(undefined8 *)((long)&pTVar4->value_ + lVar7) =
           *(undefined8 *)((long)&pTVar3[-uVar9].value_ + lVar7);
      uVar1 = *(ushort *)((long)&pTVar3[-uVar9].tt_ + lVar7);
      *(ushort *)((long)&pTVar4->tt_ + lVar7) = uVar1;
      if (((short)uVar1 < 0) &&
         ((lVar2 = *(long *)((long)&pTVar4->value_ + lVar7),
          (uVar1 & 0x7f) != (ushort)*(byte *)(lVar2 + 8) ||
          ((L != (lua_State *)0x0 && ((*(byte *)(lVar2 + 9) & (L->l_G->currentwhite ^ 0x18)) != 0)))
          ))) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0xb96,"void raviV_op_vararg(lua_State *, CallInfo *, LClosure *, int, int)");
      }
      lVar7 = lVar7 + 0x10;
      uVar6 = uVar6 + 1;
    } while ((ulong)uVar8 << 4 != lVar7);
  }
  if ((int)uVar6 < (int)n) {
    lVar7 = (ulong)n - (ulong)uVar6;
    pLVar5 = &pTVar4[uVar6].tt_;
    do {
      *pLVar5 = 0;
      pLVar5 = pLVar5 + 8;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  return;
}

Assistant:

void raviV_op_vararg(lua_State *L, CallInfo *ci, LClosure *cl, int a, int b) {
  StkId base = ci->u.l.base;
  StkId ra;
  int j;
  int n = cast_int(base - ci->func) - cl->p->numparams - 1;
  if (n < 0) /* less arguments than parameters? */
    n = 0;   /* no vararg arguments */
  b = b - 1;
  if (b < 0) { /* B == 0? */
    b = n;     /* get all var. arguments */
    Protect_base(luaD_checkstack(L, n));
    ra = base + a; /* previous call may change the stack */
    L->top = ra + n;
  }
  else {
    ra = base + a;
  }
  for (j = 0; j < b && j < n; j++) 
    setobjs2s(L, ra + j, base - n + j);
  for (; j < b; j++) /* complete required results with nil */
    setnilvalue(ra + j);
}